

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O0

void __thiscall
gui::DialogBox::setCancelButton(DialogBox *this,size_t index,shared_ptr<gui::Button> *button)

{
  bool bVar1;
  shared_ptr<gui::Button> *in_RDX;
  unsigned_long in_RSI;
  long in_RDI;
  shared_ptr<gui::Button> *in_stack_ffffffffffffff98;
  
  std::shared_ptr<gui::Button>::shared_ptr(in_RDX,in_stack_ffffffffffffff98);
  setOptionButton(this,index,button);
  std::shared_ptr<gui::Button>::~shared_ptr((shared_ptr<gui::Button> *)0x24d948);
  bVar1 = std::operator!=(in_RDX,in_stack_ffffffffffffff98);
  if (!bVar1) {
    in_RSI = std::numeric_limits<unsigned_long>::max();
  }
  *(unsigned_long *)(in_RDI + 0x268) = in_RSI;
  return;
}

Assistant:

void DialogBox::setCancelButton(size_t index, std::shared_ptr<Button> button) {
    setOptionButton(index, button);
    cancelIndex_ = (button != nullptr ? index : std::numeric_limits<size_t>::max());
}